

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::insert
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QXdgDBusImageStruct **ppQVar1;
  qsizetype *pqVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  QArrayData *pQVar4;
  char *pcVar5;
  qsizetype qVar6;
  long lVar8;
  QXdgDBusImageStruct *pQVar9;
  qsizetype inserts;
  bool bVar10;
  
  uVar3 = t->width;
  uVar7 = t->height;
  pQVar4 = &((t->data).d.d)->super_QArrayData;
  pcVar5 = (t->data).d.ptr;
  qVar6 = (t->data).d.size;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar10 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
           super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar10),n,
             (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  if (i == 0 && bVar10) {
    if (n != 0) {
      do {
        pQVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
        pQVar9[-1].width = uVar3;
        pQVar9[-1].height = uVar7;
        pQVar9[-1].data.d.d = (Data *)pQVar4;
        pQVar9[-1].data.d.ptr = pcVar5;
        pQVar9[-1].data.d.size = qVar6;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        n = n + -1;
        ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                   super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                  super_QArrayDataPointer<QXdgDBusImageStruct>.size;
        *pqVar2 = *pqVar2 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + i;
    memmove(pQVar9 + n,pQVar9,
            ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size - i) * 0x20);
    lVar8 = n;
    if (n != 0) {
      do {
        pQVar9->width = uVar3;
        pQVar9->height = uVar7;
        (pQVar9->data).d.d = (Data *)pQVar4;
        (pQVar9->data).d.ptr = pcVar5;
        (pQVar9->data).d.size = qVar6;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar8 = lVar8 + -1;
        pQVar9 = pQVar9 + 1;
      } while (lVar8 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
              super_QArrayDataPointer<QXdgDBusImageStruct>.size;
    *pqVar2 = *pqVar2 + n;
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }